

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caniter.cpp
# Opt level: O2

void __thiscall
icu_63::CanonicalIterator::setSource
          (CanonicalIterator *this,UnicodeString *newSource,UErrorCode *status)

{
  size_t s;
  short sVar1;
  UBool UVar2;
  uint uVar3;
  uint uVar4;
  undefined8 *puVar5;
  UMemory *pUVar6;
  UnicodeString *pUVar7;
  UnicodeString **ppUVar8;
  int32_t *piVar9;
  UnicodeString *pUVar10;
  ulong uVar11;
  long lVar12;
  int iVar13;
  UnicodeString *p;
  int iVar14;
  ulong uVar15;
  long lVar16;
  uint local_54;
  
  pUVar10 = &this->source;
  pUVar7 = newSource;
  (*(this->nfd->super_UObject)._vptr_UObject[3])(this->nfd,newSource,pUVar10);
  if (U_ZERO_ERROR < *status) {
    return;
  }
  this->done = '\0';
  cleanPieces(this);
  sVar1 = (newSource->fUnion).fStackFields.fLengthAndFlags;
  if (sVar1 < 0) {
    iVar13 = (newSource->fUnion).fFields.fLength;
  }
  else {
    iVar13 = (int)sVar1 >> 5;
  }
  if (iVar13 == 0) {
    ppUVar8 = (UnicodeString **)uprv_malloc_63(8);
    this->pieces = ppUVar8;
    piVar9 = (int32_t *)uprv_malloc_63(4);
    this->pieces_lengths = piVar9;
    this->pieces_length = 1;
    piVar9 = (int32_t *)uprv_malloc_63(4);
    this->current = piVar9;
    this->current_length = 1;
    if (((piVar9 != (int32_t *)0x0) && (this->pieces != (UnicodeString **)0x0)) &&
       (this->pieces_lengths != (int32_t *)0x0)) {
      *piVar9 = 0;
      puVar5 = (undefined8 *)UMemory::operator_new__((UMemory *)0x48,(size_t)pUVar7);
      if (puVar5 == (undefined8 *)0x0) {
        pUVar10 = (UnicodeString *)0x0;
      }
      else {
        *puVar5 = 1;
        pUVar10 = (UnicodeString *)(puVar5 + 1);
        puVar5[1] = &PTR__UnicodeString_003daac8;
        *(undefined2 *)(puVar5 + 2) = 2;
      }
      *this->pieces = pUVar10;
      *this->pieces_lengths = 1;
      if (*this->pieces != (UnicodeString *)0x0) {
        return;
      }
    }
  }
  else {
    sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
    if (sVar1 < 0) {
      iVar13 = (this->source).fUnion.fFields.fLength;
    }
    else {
      iVar13 = (int)sVar1 >> 5;
    }
    lVar16 = (long)iVar13 * 0x40;
    pUVar6 = (UMemory *)0xffffffffffffffff;
    if (-1 < iVar13) {
      pUVar6 = (UMemory *)(lVar16 + 8);
    }
    pUVar6 = (UMemory *)UMemory::operator_new__(pUVar6,(size_t)pUVar7);
    if (pUVar6 != (UMemory *)0x0) {
      *(long *)pUVar6 = (long)iVar13;
      if (iVar13 != 0) {
        lVar12 = 0;
        do {
          *(undefined ***)(pUVar6 + lVar12 + 8) = &PTR__UnicodeString_003daac8;
          *(undefined2 *)(pUVar6 + lVar12 + 0x10) = 2;
          lVar12 = lVar12 + 0x40;
        } while (lVar16 != lVar12);
      }
      pUVar7 = (UnicodeString *)(pUVar6 + 8);
      local_54 = 0;
      uVar3 = UnicodeString::char32At(pUVar10,0);
      iVar13 = -(uint)(uVar3 < 0x10000);
      iVar14 = 0;
      while( true ) {
        uVar3 = iVar13 + 2;
        sVar1 = (this->source).fUnion.fStackFields.fLengthAndFlags;
        if (sVar1 < 0) {
          iVar13 = (this->source).fUnion.fFields.fLength;
        }
        else {
          iVar13 = (int)sVar1 >> 5;
        }
        lVar16 = (long)iVar14;
        if (iVar13 <= (int)uVar3) break;
        uVar4 = UnicodeString::char32At(pUVar10,uVar3);
        UVar2 = Normalizer2Impl::isCanonSegmentStarter(this->nfcImpl,uVar4);
        if (UVar2 != '\0') {
          iVar14 = iVar14 + 1;
          UnicodeString::doExtract(pUVar10,local_54,uVar3 - local_54,pUVar7 + lVar16);
          local_54 = uVar3;
        }
        iVar13 = uVar3 - (uVar4 < 0x10000);
      }
      p = (UnicodeString *)(ulong)local_54;
      uVar4 = iVar14 + 1;
      UnicodeString::doExtract(pUVar10,local_54,uVar3 - local_54,pUVar7 + lVar16);
      ppUVar8 = (UnicodeString **)uprv_malloc_63(lVar16 * 8 + 8);
      this->pieces = ppUVar8;
      this->pieces_length = uVar4;
      s = lVar16 * 4 + 4;
      piVar9 = (int32_t *)uprv_malloc_63(s);
      this->pieces_lengths = piVar9;
      piVar9 = (int32_t *)uprv_malloc_63(s);
      this->current = piVar9;
      this->current_length = uVar4;
      if (((this->pieces != (UnicodeString **)0x0) && (this->pieces_lengths != (int32_t *)0x0)) &&
         (piVar9 != (int32_t *)0x0)) {
        uVar11 = 0;
        uVar15 = (ulong)uVar4;
        if ((int)uVar4 < 1) {
          uVar15 = uVar11;
        }
        for (; uVar15 != uVar11; uVar11 = uVar11 + 1) {
          piVar9[uVar11] = 0;
        }
        lVar16 = 0;
        for (lVar12 = 0; lVar12 < this->pieces_length; lVar12 = lVar12 + 1) {
          p = pUVar7;
          pUVar10 = getEquivalents(this,pUVar7,(int32_t *)((long)this->pieces_lengths + lVar16),
                                   status);
          *(UnicodeString **)((long)this->pieces + lVar16 * 2) = pUVar10;
          lVar16 = lVar16 + 4;
          pUVar7 = pUVar7 + 1;
        }
        if (*(long *)pUVar6 != 0) {
          lVar16 = *(long *)pUVar6 << 6;
          do {
            UnicodeString::~UnicodeString((UnicodeString *)(pUVar6 + lVar16 + -0x38));
            lVar16 = lVar16 + -0x40;
          } while (lVar16 != 0);
        }
        UMemory::operator_delete__(pUVar6,p);
        return;
      }
      *status = U_MEMORY_ALLOCATION_ERROR;
      if (*(long *)pUVar6 != 0) {
        lVar16 = *(long *)pUVar6 << 6;
        do {
          UnicodeString::~UnicodeString((UnicodeString *)(pUVar6 + lVar16 + -0x38));
          lVar16 = lVar16 + -0x40;
        } while (lVar16 != 0);
      }
      UMemory::operator_delete__(pUVar6,p);
      goto LAB_0027a90f;
    }
  }
  *status = U_MEMORY_ALLOCATION_ERROR;
LAB_0027a90f:
  cleanPieces(this);
  return;
}

Assistant:

void CanonicalIterator::setSource(const UnicodeString &newSource, UErrorCode &status) {
    int32_t list_length = 0;
    UChar32 cp = 0;
    int32_t start = 0;
    int32_t i = 0;
    UnicodeString *list = NULL;

    nfd.normalize(newSource, source, status);
    if(U_FAILURE(status)) {
      return;
    }
    done = FALSE;

    cleanPieces();

    // catch degenerate case
    if (newSource.length() == 0) {
        pieces = (UnicodeString **)uprv_malloc(sizeof(UnicodeString *));
        pieces_lengths = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        pieces_length = 1;
        current = (int32_t*)uprv_malloc(1 * sizeof(int32_t));
        current_length = 1;
        if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        current[0] = 0;
        pieces[0] = new UnicodeString[1];
        pieces_lengths[0] = 1;
        if (pieces[0] == 0) {
            status = U_MEMORY_ALLOCATION_ERROR;
            goto CleanPartialInitialization;
        }
        return;
    }


    list = new UnicodeString[source.length()];
    if (list == 0) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    // i should initialy be the number of code units at the 
    // start of the string
    i = U16_LENGTH(source.char32At(0));
    //int32_t i = 1;
    // find the segments
    // This code iterates through the source string and 
    // extracts segments that end up on a codepoint that
    // doesn't start any decompositions. (Analysis is done
    // on the NFD form - see above).
    for (; i < source.length(); i += U16_LENGTH(cp)) {
        cp = source.char32At(i);
        if (nfcImpl.isCanonSegmentStarter(cp)) {
            source.extract(start, i-start, list[list_length++]); // add up to i
            start = i;
        }
    }
    source.extract(start, i-start, list[list_length++]); // add last one


    // allocate the arrays, and find the strings that are CE to each segment
    pieces = (UnicodeString **)uprv_malloc(list_length * sizeof(UnicodeString *));
    pieces_length = list_length;
    pieces_lengths = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current = (int32_t*)uprv_malloc(list_length * sizeof(int32_t));
    current_length = list_length;
    if (pieces == NULL || pieces_lengths == NULL || current == NULL) {
        status = U_MEMORY_ALLOCATION_ERROR;
        goto CleanPartialInitialization;
    }

    for (i = 0; i < current_length; i++) {
        current[i] = 0;
    }
    // for each segment, get all the combinations that can produce 
    // it after NFD normalization
    for (i = 0; i < pieces_length; ++i) {
        //if (PROGRESS) printf("SEGMENT\n");
        pieces[i] = getEquivalents(list[i], pieces_lengths[i], status);
    }

    delete[] list;
    return;
// Common section to cleanup all local variables and reset object variables.
CleanPartialInitialization:
    if (list != NULL) {
        delete[] list;
    }
    cleanPieces();
}